

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool updateAndroidFiles(Options *options)

{
  bool bVar1;
  
  if (options->verbose == true) {
    fwrite("Updating Android package files with project settings.\n",0x36,1,_stdout);
  }
  bVar1 = updateLibsXml(options);
  if (bVar1) {
    bVar1 = updateAndroidManifest(options);
    return bVar1;
  }
  return false;
}

Assistant:

bool updateAndroidFiles(Options &options)
{
    if (options.verbose)
        fprintf(stdout, "Updating Android package files with project settings.\n");

    if (!updateLibsXml(&options))
        return false;

    if (!updateAndroidManifest(options))
        return false;

    return true;
}